

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

piga_status piga_client_connect(piga_client *client,char *name,int name_length)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  piga_status local_2c;
  int local_28;
  piga_status status;
  int shared_memory_size;
  int name_length_local;
  char *name_local;
  piga_client *client_local;
  
  local_28 = client->config->player_count * 0x138 + 0x78;
  status = name_length;
  _shared_memory_size = name;
  name_local = (char *)client;
  iVar1 = shmget(client->config->shared_memory_key,(long)local_28,0x1b6);
  *(int *)(name_local + 8) = iVar1;
  if (*(int *)(name_local + 8) == -1) {
    client_local._4_4_ = PIGA_ERROR_COULD_NOT_OPEN_SHARED_MEMORY;
  }
  else {
    pvVar2 = shmat(*(int *)(name_local + 8),(void *)0x0,0);
    *(void **)(name_local + 0x10) = pvVar2;
    if (*(long *)(name_local + 0x10) == -1) {
      client_local._4_4_ = PIGA_ERROR_COULD_NOT_ATTACH_SHARED_MEMORY;
    }
    else {
      piga_shared_memory_map
                (name_local + 0x10,*(undefined8 *)(name_local + 0x10),
                 (int)(short)*(char *)(*(long *)name_local + 4));
      uVar3 = piga_event_queue_connect_to_shm(0x1b62,name_local + 0x38,&local_2c);
      *(undefined8 *)(name_local + 0x30) = uVar3;
      if (local_2c == PIGA_STATUS_OK) {
        uVar3 = piga_event_queue_create_default_in_shm
                          (name_local + 0x28,&local_2c,*(undefined8 *)(name_local + 0x30),
                           _shared_memory_size,status);
        *(undefined8 *)(name_local + 0x20) = uVar3;
        piga_event_queue_set_type_mask
                  (*(undefined8 *)(name_local + 0x20),*(undefined4 *)(*(long *)name_local + 8));
        if (local_2c == PIGA_STATUS_OK) {
          client_local._4_4_ = PIGA_STATUS_OK;
        }
        else {
          client_local._4_4_ = local_2c;
        }
      }
      else {
        client_local._4_4_ = local_2c;
      }
    }
  }
  return client_local._4_4_;
}

Assistant:

piga_status piga_client_connect(piga_client* client, const char *name, int name_length)
{
    int shared_memory_size = 
        client->config->player_count * sizeof(piga_player)
        + 120; // Padding
        
    client->shared_memory_id = shmget(client->config->shared_memory_key, 
        shared_memory_size, 0666);
    if(client->shared_memory_id == -1)
        return PIGA_ERROR_COULD_NOT_OPEN_SHARED_MEMORY;
    
    // Mapping the start segment
    client->shared_memory.start = shmat(client->shared_memory_id, 0, 0);
    if(client->shared_memory.start == (void*) -1)
        return PIGA_ERROR_COULD_NOT_ATTACH_SHARED_MEMORY;
    
    piga_shared_memory_map(&client->shared_memory, client->shared_memory.start, client->config->player_count);
    
    // Attach to the host-queue (out-queue).
    piga_status status;
    client->out_queue = piga_event_queue_connect_to_shm(
        PIGA_EVENT_QUEUE_START_KEY, 
        &client->out_queue_shm_id, 
        &status
    );
    
    if(status != PIGA_STATUS_OK)
        return status;
    
    // Create the in-queue. 
    client->in_queue = piga_event_queue_create_default_in_shm(
        &client->in_queue_shm_id,
        &status,
        client->out_queue,
        name, name_length
    );
    
    piga_event_queue_set_type_mask(client->in_queue, client->config->event_type_mask);
    
    if(status != PIGA_STATUS_OK)
        return status;
    
    return PIGA_STATUS_OK;
}